

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O1

Am_Wrapper * get_text_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *initial;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Object owner;
  Am_Value v;
  char line [100];
  ostrstream oss;
  Am_Object local_200;
  Am_Value local_1f8;
  char local_1e8 [112];
  ostrstream local_178 [360];
  
  if (get_text_widget_value_proc(Am_Object&)::val == '\0') {
    iVar2 = __cxa_guard_acquire(&get_text_widget_value_proc(Am_Object&)::val);
    if (iVar2 != 0) {
      Am_String::Am_String(&get_text_widget_value_proc::val,"",true);
      __cxa_atexit(Am_String::~Am_String,&get_text_widget_value_proc::val,&__dso_handle);
      __cxa_guard_release(&get_text_widget_value_proc(Am_Object&)::val);
    }
  }
  Am_Object::Get_Object(&local_200,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_200);
  if (bVar1) {
    initial = Am_Object::Get(&local_200,0x169,0);
    Am_Value::Am_Value(&local_1f8,initial);
    if (local_1f8.type != 0x8008) {
      std::ostrstream::ostrstream(local_178,local_1e8,100,_S_out);
      poVar3 = operator<<((ostream *)local_178,&local_1f8);
      std::ostream::put((char)poVar3);
      Am_Value::operator=(&local_1f8,local_1e8);
      std::ostrstream::~ostrstream(local_178);
    }
    pAVar4 = Am_Value::operator_cast_to_Am_Wrapper_(&local_1f8);
    Am_Value::~Am_Value(&local_1f8);
  }
  else {
    pAVar4 = Am_String::operator_cast_to_Am_Wrapper_(&get_text_widget_value_proc::val);
  }
  Am_Object::~Am_Object(&local_200);
  return pAVar4;
}

Assistant:

Am_Define_String_Formula(get_text_widget_value)
{
  static Am_String val("");

  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Am_Value v = owner.Get(Am_VALUE);
    if (v.type != Am_STRING) { //generate string from the value by printing it
      char line[100];
      OSTRSTREAM_CONSTR(oss, line, 100, std::ios::out);
      oss << v << std::ends;
      OSTRSTREAM_COPY(oss, line, 100);
      v = line; //now use the string as the value
    }
    return v;
  } else
    return val;
}